

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scoped_ptr.h
# Opt level: O0

void __thiscall
MeCab::scoped_ptr<MeCab::ContextID>::reset(scoped_ptr<MeCab::ContextID> *this,ContextID *p)

{
  void *pvVar1;
  undefined8 in_RSI;
  ContextID *in_RDI;
  
  pvVar1 = *(void **)&(in_RDI->left_)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (pvVar1 != (void *)0x0) {
    ContextID::~ContextID(in_RDI);
    operator_delete(pvVar1);
  }
  *(undefined8 *)&(in_RDI->left_)._M_t._M_impl.super__Rb_tree_header._M_header = in_RSI;
  return;
}

Assistant:

void reset(T * p = 0) {
    delete ptr_;
    ptr_ = p;
  }